

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O3

void __thiscall SPSUnit::insertHrdParameters(SPSUnit *this)

{
  HRDParams *params;
  pointer pHVar1;
  undefined3 uVar2;
  int iVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  pointer pHVar7;
  pointer pHVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  pointer pHVar13;
  long lVar14;
  int vcl_hrd_len;
  long lVar15;
  long lVar16;
  bool bVar17;
  HRDParams *local_50;
  int local_48;
  int local_44;
  long local_40;
  long local_38;
  
  pHVar7 = (this->mvcNalHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>._M_impl
           .super__Vector_impl_data._M_start;
  lVar15 = (long)(this->mvcNalHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pHVar7;
  if (lVar15 != 0) {
    lVar11 = (lVar15 >> 5) * -0x5555555555555555;
    do {
      lVar11 = lVar11 + -1;
      pHVar8 = (pointer)(&pHVar7[-1].isPresent + lVar15);
      if (pHVar8->isPresent == true) {
        pHVar13 = (this->mvcVclHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((&pHVar13[-1].isPresent)[lVar15] == false) {
          iVar9 = *(int *)((long)pHVar7 + lVar15 + -0x5c);
          vcl_hrd_len = *(int *)((long)pHVar13 + lVar15 + -0x5c);
          pHVar13 = pHVar13 + lVar11;
LAB_001c2c05:
          bVar17 = pHVar8->isPresent;
          uVar2 = *(undefined3 *)&pHVar8->field_0x1;
          iVar3 = pHVar8->bitLen;
          *(undefined8 *)((long)&pHVar13->bitLen + 2) =
               *(undefined8 *)((long)pHVar7 + lVar15 + -0x5a);
          pHVar13->isPresent = bVar17;
          *(undefined3 *)&pHVar13->field_0x1 = uVar2;
          pHVar13->bitLen = iVar3;
          pHVar8 = pHVar13;
          pHVar13 = pHVar7 + lVar11;
          goto LAB_001c2c1e;
        }
      }
      else {
        iVar9 = *(int *)((long)pHVar7 + lVar15 + -0x5c);
        pHVar1 = (this->mvcVclHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pHVar13 = (pointer)(&pHVar1[-1].isPresent + lVar15);
        vcl_hrd_len = *(int *)((long)pHVar1 + lVar15 + -0x5c);
        if (pHVar13->isPresent == false) goto LAB_001c2c05;
        bVar17 = pHVar13->isPresent;
        uVar2 = *(undefined3 *)&pHVar13->field_0x1;
        iVar3 = pHVar13->bitLen;
        *(undefined8 *)((long)pHVar7 + lVar15 + -0x5a) =
             *(undefined8 *)((long)pHVar1 + lVar15 + -0x5a);
        pHVar8->isPresent = bVar17;
        *(undefined3 *)&pHVar8->field_0x1 = uVar2;
        pHVar8->bitLen = iVar3;
LAB_001c2c1e:
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  (&pHVar8->bit_rate_value_minus1,&pHVar13->bit_rate_value_minus1);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  (&pHVar8->cpb_size_value_minus1,&pHVar13->cpb_size_value_minus1);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&pHVar8->cbr_flag,&pHVar13->cbr_flag);
        uVar4 = pHVar13->cpb_removal_delay_length_minus1;
        uVar5 = pHVar13->dpb_output_delay_length_minus1;
        uVar6 = pHVar13->time_offset_length;
        pHVar8->initial_cpb_removal_delay_length_minus1 =
             pHVar13->initial_cpb_removal_delay_length_minus1;
        pHVar8->cpb_removal_delay_length_minus1 = uVar4;
        pHVar8->dpb_output_delay_length_minus1 = uVar5;
        pHVar8->time_offset_length = uVar6;
        insertHrdData(this,(this->mvcHrdParamsBitPos).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar11],iVar9,vcl_hrd_len,false,
                      (HRDParams *)
                      (&(this->mvcNalHrdParams).
                        super__Vector_base<HRDParams,_std::allocator<HRDParams>_>._M_impl.
                        super__Vector_impl_data._M_start[-1].isPresent + lVar15));
        pHVar7 = (this->mvcNalHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        (&pHVar7[-1].isPresent)[lVar15] = true;
        (&(this->mvcVclHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>._M_impl.
          super__Vector_impl_data._M_start[-1].isPresent)[lVar15] = true;
      }
      lVar15 = lVar15 + -0x60;
    } while (lVar11 != 0);
  }
  params = &this->nalHrdParams;
  if ((this->nalHrdParams).isPresent == false) {
    local_44 = (this->nalHrdParams).bitLen;
    local_48 = (this->vclHrdParams).bitLen;
    if ((this->vclHrdParams).isPresent == false) goto LAB_001c2d44;
    bVar17 = (this->vclHrdParams).isPresent;
    uVar2 = *(undefined3 *)&(this->vclHrdParams).field_0x1;
    iVar9 = (this->vclHrdParams).bitLen;
    *(undefined8 *)((long)&(this->nalHrdParams).bitLen + 2) =
         *(undefined8 *)((long)&(this->vclHrdParams).bitLen + 2);
    params->isPresent = bVar17;
    *(undefined3 *)&params->field_0x1 = uVar2;
    params->bitLen = iVar9;
    local_38 = 0x198;
    local_40 = 0x138;
    lVar12 = 0x180;
    lVar14 = 0x120;
    lVar15 = 0x168;
    lVar16 = 0x108;
    lVar11 = 0x150;
    lVar10 = 0xf0;
  }
  else {
    if ((this->vclHrdParams).isPresent != false) goto LAB_001c2e04;
    local_44 = (this->nalHrdParams).bitLen;
    local_48 = (this->vclHrdParams).bitLen;
LAB_001c2d44:
    bVar17 = params->isPresent;
    uVar2 = *(undefined3 *)&params->field_0x1;
    iVar9 = params->bitLen;
    *(undefined8 *)((long)&(this->vclHrdParams).bitLen + 2) =
         *(undefined8 *)((long)&(this->nalHrdParams).bitLen + 2);
    (this->vclHrdParams).isPresent = bVar17;
    *(undefined3 *)&(this->vclHrdParams).field_0x1 = uVar2;
    (this->vclHrdParams).bitLen = iVar9;
    local_38 = 0x138;
    local_40 = 0x198;
    lVar12 = 0x120;
    lVar14 = 0x180;
    lVar15 = 0x108;
    lVar16 = 0x168;
    lVar11 = 0xf0;
    lVar10 = 0x150;
  }
  local_50 = &this->vclHrdParams;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             ((long)&(this->super_NALUnit)._vptr_NALUnit + lVar10),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             ((long)&(this->super_NALUnit)._vptr_NALUnit + lVar11));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             ((long)&(this->super_NALUnit)._vptr_NALUnit + lVar16),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             ((long)&(this->super_NALUnit)._vptr_NALUnit + lVar15));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((long)&(this->super_NALUnit)._vptr_NALUnit + lVar14),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((long)&(this->super_NALUnit)._vptr_NALUnit + lVar12));
  *(undefined4 *)((long)&(this->super_NALUnit)._vptr_NALUnit + local_40) =
       *(undefined4 *)((long)&(this->super_NALUnit)._vptr_NALUnit + local_38);
  iVar9 = this->hrdParamsBitPos;
  bVar17 = iVar9 == -1;
  if (bVar17) {
    iVar9 = this->vui_parameters_bit_pos;
    local_44 = 0;
    local_48 = 0;
  }
  insertHrdData(this,iVar9,local_44,local_48,bVar17,params);
  local_50->isPresent = true;
LAB_001c2e04:
  (this->nalHrdParams).isPresent = true;
  (this->vclHrdParams).isPresent = true;
  if (this->fixed_frame_rate_flag == 0) {
    updateTimingInfo(this);
    return;
  }
  return;
}

Assistant:

void SPSUnit::insertHrdParameters()
{
    for (size_t i = mvcNalHrdParams.size(); i-- > 0;)
    {
        if (!mvcNalHrdParams[i].isPresent || !mvcVclHrdParams[i].isPresent)
        {
            const int nalBitLen = mvcNalHrdParams[i].bitLen;
            const int vclBitLen = mvcVclHrdParams[i].bitLen;

            if (mvcNalHrdParams[i].isPresent || !mvcVclHrdParams[i].isPresent)
                mvcVclHrdParams[i] = mvcNalHrdParams[i];
            else if (!mvcNalHrdParams[i].isPresent || mvcVclHrdParams[i].isPresent)
                mvcNalHrdParams[i] = mvcVclHrdParams[i];
            else
            {
                mvcNalHrdParams[i].resetDefault(true);
                mvcVclHrdParams[i].resetDefault(true);
            }

            insertHrdData(mvcHrdParamsBitPos[i], nalBitLen, vclBitLen, false, mvcNalHrdParams[i]);
            mvcNalHrdParams[i].isPresent = true;
            mvcVclHrdParams[i].isPresent = true;
        }
    }

    if (!nalHrdParams.isPresent || !vclHrdParams.isPresent)
    {
        const int nalBitLen = nalHrdParams.bitLen;
        const int vclBitLen = vclHrdParams.bitLen;

        if (nalHrdParams.isPresent || !vclHrdParams.isPresent)
            vclHrdParams = nalHrdParams;
        else if (!nalHrdParams.isPresent || vclHrdParams.isPresent)
            nalHrdParams = vclHrdParams;
        else
        {
            nalHrdParams.resetDefault(false);
            vclHrdParams.resetDefault(false);
        }

        if (hrdParamsBitPos != -1)
            insertHrdData(hrdParamsBitPos, nalBitLen, vclBitLen, false, nalHrdParams);
        else
            insertHrdData(vui_parameters_bit_pos, 0, 0, true, nalHrdParams);
        nalHrdParams.isPresent = true;
        vclHrdParams.isPresent = true;
    }
    nalHrdParams.isPresent = true;
    vclHrdParams.isPresent = true;

    if (!fixed_frame_rate_flag)
        updateTimingInfo();
}